

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

void __thiscall nvim::Nvim::async_tabpage_is_valid(Nvim *this,Tabpage tabpage)

{
  allocator local_41;
  Tabpage local_40;
  string local_38;
  
  local_40 = tabpage;
  std::__cxx11::string::string((string *)&local_38,"nvim_tabpage_is_valid",&local_41);
  NvimRPC::async_call<long>(&this->client_,&local_38,&local_40);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Nvim::async_tabpage_is_valid(Tabpage tabpage) {
    client_.async_call("nvim_tabpage_is_valid", tabpage);
}